

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall testing::TestSuite::Run(TestSuite *this)

{
  long lVar1;
  TestEventRepeater *pTVar2;
  pointer ppTVar3;
  pointer piVar4;
  bool bVar5;
  bool bVar6;
  long lVar7;
  TestInfo **ppTVar8;
  pointer ppTVar9;
  long lVar10;
  uint uVar11;
  pair<testing::TestInfo_**,_long> pVar12;
  
  if (this->should_run_ != true) {
    return;
  }
  UnitTest::GetInstance();
  internal::MutexBase::Lock(&UnitTest::GetInstance::instance.mutex_.super_MutexBase);
  (UnitTest::GetInstance::instance.impl_)->current_test_suite_ = this;
  internal::MutexBase::Unlock(&UnitTest::GetInstance::instance.mutex_.super_MutexBase);
  UnitTest::GetInstance();
  pTVar2 = ((UnitTest::GetInstance::instance.impl_)->listeners_).repeater_;
  ppTVar9 = (this->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppTVar3 = (this->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppTVar9 != ppTVar3) {
    lVar7 = (long)ppTVar3 - (long)ppTVar9 >> 3;
    pVar12 = std::get_temporary_buffer<testing::TestInfo*>((lVar7 - (lVar7 + 1 >> 0x3f)) + 1 >> 1);
    lVar7 = pVar12.second;
    ppTVar8 = pVar12.first;
    if (ppTVar8 == (TestInfo **)0x0) {
      std::
      __inplace_stable_sort<__gnu_cxx::__normal_iterator<testing::TestInfo**,std::vector<testing::TestInfo*,std::allocator<testing::TestInfo*>>>,__gnu_cxx::__ops::_Iter_comp_iter<testing::TestSuite::Run()::__0>>
                (ppTVar9,ppTVar3);
      lVar7 = 0;
    }
    else {
      std::
      __stable_sort_adaptive<__gnu_cxx::__normal_iterator<testing::TestInfo**,std::vector<testing::TestInfo*,std::allocator<testing::TestInfo*>>>,testing::TestInfo**,long,__gnu_cxx::__ops::_Iter_comp_iter<testing::TestSuite::Run()::__0>>
                (ppTVar9,ppTVar3,ppTVar8,lVar7);
    }
    operator_delete(ppTVar8,lVar7 << 3);
  }
  (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[6])(pTVar2,this);
  (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[7])(pTVar2,this);
  UnitTest::GetInstance();
  UnitTest::UponLeavingGTest(&UnitTest::GetInstance::instance);
  UnitTest::GetInstance();
  if (this->set_up_tc_ != (SetUpTestSuiteFunc)0x0) {
    (*this->set_up_tc_)();
  }
  bVar5 = TestResult::Failed(&this->ad_hoc_test_result_);
  bVar6 = true;
  if (!bVar5) {
    bVar6 = TestResult::Skipped(&this->ad_hoc_test_result_);
  }
  lVar7 = std::chrono::_V2::system_clock::now();
  this->start_timestamp_ = lVar7 / 1000000;
  lVar7 = std::chrono::_V2::steady_clock::now();
  ppTVar9 = (this->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->test_info_list_).
                              super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar9) >> 3)) {
    lVar10 = 1;
    do {
      lVar1 = lVar10 + -1;
      if (bVar6 == false) {
        piVar4 = (this->test_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar11 = 0xffffffff;
        if (lVar1 < (int)((ulong)((long)(this->test_indices_).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish - (long)piVar4) >> 2)) {
          uVar11 = piVar4[lVar10 + -1];
        }
        TestInfo::Run(ppTVar9[uVar11]);
      }
      else {
        piVar4 = (this->test_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar11 = 0xffffffff;
        if (lVar1 < (int)((ulong)((long)(this->test_indices_).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish - (long)piVar4) >> 2)) {
          uVar11 = piVar4[lVar10 + -1];
        }
        TestInfo::Skip(ppTVar9[uVar11]);
      }
      if (FLAGS_gtest_fail_fast == '\x01') {
        piVar4 = (this->test_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar11 = 0xffffffff;
        if (lVar1 < (int)((ulong)((long)(this->test_indices_).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish - (long)piVar4) >> 2)) {
          uVar11 = piVar4[lVar10 + -1];
        }
        bVar5 = TestResult::Failed(&(this->test_info_list_).
                                    super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar11]->result_);
        if (bVar5) goto LAB_00121824;
      }
      ppTVar9 = (this->test_info_list_).
                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      bVar5 = lVar10 < (int)((ulong)((long)(this->test_info_list_).
                                           super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)ppTVar9) >> 3);
      lVar10 = lVar10 + 1;
    } while (bVar5);
  }
LAB_00121838:
  lVar10 = std::chrono::_V2::steady_clock::now();
  this->elapsed_time_ = (lVar10 - lVar7) / 1000000;
  UnitTest::GetInstance();
  UnitTest::UponLeavingGTest(&UnitTest::GetInstance::instance);
  UnitTest::GetInstance();
  if (this->tear_down_tc_ != (TearDownTestSuiteFunc)0x0) {
    (*this->tear_down_tc_)();
  }
  (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xc])(pTVar2,this);
  (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xd])(pTVar2,this);
  UnitTest::GetInstance();
  internal::MutexBase::Lock(&UnitTest::GetInstance::instance.mutex_.super_MutexBase);
  (UnitTest::GetInstance::instance.impl_)->current_test_suite_ = (TestSuite *)0x0;
  internal::MutexBase::Unlock(&UnitTest::GetInstance::instance.mutex_.super_MutexBase);
  return;
LAB_00121824:
  for (; ppTVar9 = (this->test_info_list_).
                   super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                   _M_impl.super__Vector_impl_data._M_start,
      (int)lVar10 <
      (int)((ulong)((long)(this->test_info_list_).
                          super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar9) >> 3);
      lVar10 = lVar10 + 1) {
    piVar4 = (this->test_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar11 = 0xffffffff;
    if (lVar10 < (int)((ulong)((long)(this->test_indices_).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish - (long)piVar4) >> 2)) {
      uVar11 = piVar4[lVar10];
    }
    TestInfo::Skip(ppTVar9[uVar11]);
  }
  goto LAB_00121838;
}

Assistant:

void TestSuite::Run() {
  if (!should_run_) return;

  UnitTest::GetInstance()->set_current_test_suite(this);

  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();

  // Ensure our tests are in a deterministic order.
  //
  // We do this by sorting lexicographically on (file, line number), providing
  // an order matching what the user can see in the source code.
  //
  // In the common case the line number comparison shouldn't be necessary,
  // because the registrations made by the TEST macro are executed in order
  // within a translation unit. But this is not true of the manual registration
  // API, and in more exotic scenarios a single file may be part of multiple
  // translation units.
  std::stable_sort(test_info_list_.begin(), test_info_list_.end(),
                   [](const TestInfo* const a, const TestInfo* const b) {
                     if (const int result = std::strcmp(a->file(), b->file())) {
                       return result < 0;
                     }

                     return a->line() < b->line();
                   });

  // Call both legacy and the new API
  repeater->OnTestSuiteStart(*this);
//  Legacy API is deprecated but still available
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI_
  repeater->OnTestCaseStart(*this);
#endif  //  GTEST_REMOVE_LEGACY_TEST_CASEAPI_

  UnitTest::GetInstance()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &TestSuite::RunSetUpTestSuite, "SetUpTestSuite()");

  const bool skip_all =
      ad_hoc_test_result().Failed() || ad_hoc_test_result().Skipped();

  start_timestamp_ = internal::GetTimeInMillis();
  internal::Timer timer;
  for (int i = 0; i < total_test_count(); i++) {
    if (skip_all) {
      GetMutableTestInfo(i)->Skip();
    } else {
      GetMutableTestInfo(i)->Run();
    }
    if (GTEST_FLAG_GET(fail_fast) &&
        GetMutableTestInfo(i)->result()->Failed()) {
      for (int j = i + 1; j < total_test_count(); j++) {
        GetMutableTestInfo(j)->Skip();
      }
      break;
    }
  }
  elapsed_time_ = timer.Elapsed();

  UnitTest::GetInstance()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &TestSuite::RunTearDownTestSuite, "TearDownTestSuite()");

  // Call both legacy and the new API
  repeater->OnTestSuiteEnd(*this);
//  Legacy API is deprecated but still available
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI_
  repeater->OnTestCaseEnd(*this);
#endif  //  GTEST_REMOVE_LEGACY_TEST_CASEAPI_

  UnitTest::GetInstance()->set_current_test_suite(nullptr);
}